

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_show_select.cpp
# Opt level: O2

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> __thiscall
duckdb::Transformer::TransformShowSelect(Transformer *this,PGVariableShowSelectStmt *stmt)

{
  int iVar1;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var2;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var3;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var4;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var5;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> _Var6;
  pointer pSVar7;
  pointer pSVar8;
  long in_RDX;
  _Head_base<0UL,_duckdb::TableRef_*,_false> local_40;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_38;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_30;
  
  make_uniq<duckdb::SelectNode>();
  pSVar7 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)&stack0xffffffffffffffd0);
  make_uniq<duckdb::StarExpression>();
  local_40._M_head_impl = (TableRef *)local_38._M_head_impl;
  local_38._M_head_impl = (QueryNode *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              *)&pSVar7->select_list,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_40);
  if (local_40._M_head_impl != (TableRef *)0x0) {
    (*(local_40._M_head_impl)->_vptr_TableRef[1])();
  }
  local_40._M_head_impl = (TableRef *)0x0;
  if ((Transformer *)local_38._M_head_impl != (Transformer *)0x0) {
    (*(code *)((((Transformer *)local_38._M_head_impl)->parent).ptr)->options)();
  }
  make_uniq<duckdb::ShowRef>();
  iVar1 = *(int *)(in_RDX + 0x18);
  pSVar8 = unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true>::operator->
                     ((unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true> *)
                      &local_40);
  pSVar8->show_type = iVar1 == 0;
  TransformSelectNode((Transformer *)&stack0xffffffffffffffc8,(PGNode *)stmt,
                      SUB81(*(undefined8 *)(in_RDX + 8),0));
  pSVar8 = unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true>::operator->
                     ((unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true> *)
                      &local_40);
  _Var5._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (QueryNode *)0x0;
  _Var2._M_head_impl =
       (pSVar8->query).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
       _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
       super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
  (pSVar8->query).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var5._M_head_impl;
  if (_Var2._M_head_impl != (QueryNode *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_QueryNode + 8))();
    if ((Transformer *)local_38._M_head_impl != (Transformer *)0x0) {
      (*(code *)((((Transformer *)local_38._M_head_impl)->parent).ptr)->options)();
    }
  }
  _Var4._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (TableRef *)0x0;
  pSVar7 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)&stack0xffffffffffffffd0);
  _Var3._M_head_impl =
       (pSVar7->from_table).
       super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (pSVar7->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
  _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var3._M_head_impl != (TableRef *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_TableRef + 8))();
  }
  _Var6._M_head_impl = local_30._M_head_impl;
  local_30._M_head_impl = (SelectNode *)0x0;
  (this->parent).ptr = (Transformer *)_Var6._M_head_impl;
  if (local_40._M_head_impl != (TableRef *)0x0) {
    (*(local_40._M_head_impl)->_vptr_TableRef[1])();
    if ((_Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>)
        local_30._M_head_impl != (SelectNode *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)this;
}

Assistant:

unique_ptr<QueryNode> Transformer::TransformShowSelect(duckdb_libpgquery::PGVariableShowSelectStmt &stmt) {
	// we capture the select statement of SHOW
	auto select_node = make_uniq<SelectNode>();
	select_node->select_list.push_back(make_uniq<StarExpression>());

	auto show_ref = make_uniq<ShowRef>();
	show_ref->show_type = stmt.is_summary ? ShowType::SUMMARY : ShowType::DESCRIBE;
	show_ref->query = TransformSelectNode(*stmt.stmt);
	select_node->from_table = std::move(show_ref);
	return std::move(select_node);
}